

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType1Tracer.cpp
# Opt level: O2

EStatusCode __thiscall
CharStringType1Tracer::Type1VStem3(CharStringType1Tracer *this,LongList *inOperandList)

{
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"vstem3",&local_31);
  PrimitiveObjectsWriter::WriteKeyword(&this->mPrimitiveWriter,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return eSuccess;
}

Assistant:

EStatusCode CharStringType1Tracer::Type1VStem3(const LongList& inOperandList)
{
	mPrimitiveWriter.WriteKeyword("vstem3");
	return PDFHummus::eSuccess;
}